

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::abortMessage(Forth *this)

{
  undefined1 local_38 [8];
  string message;
  CAddr caddr;
  uint count;
  Forth *this_local;
  
  message.field_2._12_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  message.field_2._8_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  std::__cxx11::string::string((string *)local_38);
  assignStringFromCaddress
            (this,(string *)local_38,message.field_2._8_4_,(ulong)(uint)message.field_2._12_4_);
  throwMessage(this,(string *)local_38,errorAbortQuote);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void abortMessage() {
			auto count = dStack.getTop(); pop();
			auto caddr = CADDR(dStack.getTop()); pop();
			std::string message{};
			assignStringFromCaddress(message,caddr, count);
			// same action as abort()
			throwMessage(message,errorAbortQuote);
		}